

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSubContractResource::IfcSubContractResource
          (IfcSubContractResource *this)

{
  IfcSubContractResource *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x1c8,"IfcSubContractResource");
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00f5c278);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSubContractResource,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSubContractResource,_2UL> *)
             &(this->super_IfcConstructionResource).field_0x178,
             &PTR_construction_vtable_24__00f5c368);
  *(undefined8 *)&this->super_IfcConstructionResource = 0xf5c170;
  *(undefined8 *)&this->field_0x1c8 = 0xf5c260;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0xf5c198;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0xf5c1c0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0xf5c1e8;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0xf5c210;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0xf5c238;
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            ((Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_> *)
             &(this->super_IfcConstructionResource).field_0x188);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->JobDescription);
  return;
}

Assistant:

IfcSubContractResource() : Object("IfcSubContractResource") {}